

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

Variant * __thiscall
Jinx::Impl::Script::GetVariable(Variant *__return_storage_ptr__,Script *this,RuntimeID id)

{
  pointer pIVar1;
  pointer pVVar2;
  pointer pIVar3;
  pointer pIVar4;
  
  pIVar1 = (this->m_idIndexData).
           super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (this->m_idIndexData).
           super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    pIVar4 = pIVar3;
    if (pIVar4 == pIVar1) goto LAB_001f6598;
    pIVar3 = pIVar4 + -1;
  } while (pIVar4[-1].id != id);
  pVVar2 = (this->m_stack).
           super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar4[-1].index <
      (ulong)(((long)(this->m_stack).
                     super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3) *
             -0x3333333333333333)) {
    Variant::Copy(__return_storage_ptr__,pVVar2 + pIVar4[-1].index);
  }
  else {
    LogWriteLine(Error,"Attempted to access stack at invalid index");
    __return_storage_ptr__->m_type = Null;
  }
  if (pIVar4 == pIVar1) {
LAB_001f6598:
    __return_storage_ptr__->m_type = Null;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Variant Script::GetVariable(RuntimeID id) const
	{
		for (auto ritr = m_idIndexData.rbegin(); ritr != m_idIndexData.rend(); ++ritr)
		{
			if (ritr->id == id)
			{
				if (ritr->index >= m_stack.size())
				{
					LogWriteLine(LogLevel::Error, "Attempted to access stack at invalid index");
					return Variant();
				}
				return m_stack[ritr->index];
			}
		}
		return Variant();
	}